

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_end_to_end_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_adc695::RTEndToEndTest::SetUp(RTEndToEndTest *this)

{
  long in_RDI;
  TestMode in_stack_000000bc;
  EncoderTest *in_stack_000000c0;
  
  libaom_test::EncoderTest::InitializeConfig(in_stack_000000c0,in_stack_000000bc);
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x428);
  *(undefined4 *)(in_RDI + 0xcc) = 1000;
  *(undefined4 *)(in_RDI + 0xd0) = 500;
  *(undefined4 *)(in_RDI + 0xd4) = 600;
  *(undefined4 *)(in_RDI + 0xf0) = 9999;
  *(undefined4 *)(in_RDI + 0xec) = 9999;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(::libaom_test::kRealTime);

    cfg_.g_threads = threads_;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 600;
    cfg_.kf_max_dist = 9999;
    cfg_.kf_min_dist = 9999;
  }